

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O0

void __thiscall Js::ConfigFlagsTable::TranslateFlagConfiguration(ConfigFlagsTable *this)

{
  code *pcVar1;
  bool bVar2;
  char16 *buffer;
  int *piVar3;
  undefined4 *puVar4;
  int local_4c;
  int local_48;
  Number iterationsNeeded_2;
  Number iterationsToMove;
  int local_3c;
  Number profilingIterationsNeeded;
  Number iterationsNeeded_1;
  Number iterationsNeeded;
  int scannedCount;
  uint profilingInterpreter1Limit;
  uint simpleJitLimit;
  uint autoProfilingInterpreter1Limit;
  uint profilingInterpreter0Limit;
  uint autoProfilingInterpreter0Limit;
  bool dontEnforceLimitsForSimpleJitAfterOrFullJitAfter;
  anon_class_8_1_8991fb9c VerifyExecutionModeLimits;
  ConfigFlagsTable *this_local;
  
  _autoProfilingInterpreter0Limit = this;
  VerifyExecutionModeLimits.this = this;
  TranslateFlagConfiguration::anon_class_8_1_8991fb9c::operator()
            ((anon_class_8_1_8991fb9c *)&autoProfilingInterpreter0Limit);
  if ((this->ForceDynamicProfile & 1U) != 0) {
    Phases::Enable(&this->Force,DynamicProfilePhase);
  }
  if ((this->ForceJITLoopBody & 1U) != 0) {
    Phases::Enable(&this->Force,JITLoopBodyPhase);
  }
  if ((this->NoDeferParse & 1U) != 0) {
    Phases::Enable(&this->Off,DeferParsePhase);
  }
  profilingInterpreter0Limit._3_1_ = 0;
  bVar2 = IsEnabled(this,MinInterpretCountFlag);
  if ((((bVar2) || (bVar2 = IsEnabled(this,MaxInterpretCountFlag), bVar2)) &&
      (bVar2 = IsEnabled(this,SimpleJitAfterFlag), !bVar2)) &&
     (bVar2 = IsEnabled(this,FullJitAfterFlag), !bVar2)) {
    bVar2 = Phases::IsEnabled(&this->Off,SimpleJitPhase);
    if (bVar2) {
      Enable(this,FullJitAfterFlag);
      bVar2 = IsEnabled(this,MaxInterpretCountFlag);
      if (bVar2) {
        this->FullJitAfter = this->MaxInterpretCount;
      }
      else {
        this->FullJitAfter = this->MinInterpretCount;
        profilingInterpreter0Limit._3_1_ = 1;
      }
    }
    else {
      Enable(this,SimpleJitAfterFlag);
      bVar2 = IsEnabled(this,MaxInterpretCountFlag);
      if (bVar2) {
        this->SimpleJitAfter = this->MaxInterpretCount;
      }
      else {
        this->SimpleJitAfter = this->MinInterpretCount;
        profilingInterpreter0Limit._3_1_ = 1;
      }
      bVar2 = IsEnabled(this,MinInterpretCountFlag);
      if (((bVar2) && (bVar2 = IsEnabled(this,MinSimpleJitRunCountFlag), bVar2)) ||
         (bVar2 = IsEnabled(this,MaxSimpleJitRunCountFlag), bVar2)) {
        Enable(this,FullJitAfterFlag);
        this->FullJitAfter = this->SimpleJitAfter;
        bVar2 = IsEnabled(this,MaxSimpleJitRunCountFlag);
        if (bVar2) {
          this->FullJitAfter = this->MaxSimpleJitRunCount + this->FullJitAfter;
        }
        else {
          this->FullJitAfter = this->MinSimpleJitRunCount + this->FullJitAfter;
          if ((profilingInterpreter0Limit._3_1_ & 1) == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                        ,0x250,"(dontEnforceLimitsForSimpleJitAfterOrFullJitAfter)",
                                        "dontEnforceLimitsForSimpleJitAfterOrFullJitAfter");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
        }
      }
    }
  }
  bVar2 = IsEnabled(this,AutoProfilingInterpreter0LimitFlag);
  if (((!bVar2) && (bVar2 = IsEnabled(this,ProfilingInterpreter0LimitFlag), !bVar2)) &&
     ((bVar2 = IsEnabled(this,AutoProfilingInterpreter1LimitFlag), !bVar2 &&
      ((bVar2 = IsEnabled(this,SimpleJitLimitFlag), !bVar2 &&
       (bVar2 = IsEnabled(this,ProfilingInterpreter1LimitFlag), !bVar2)))))) {
    bVar2 = IsEnabled(this,ExecutionModeLimitsFlag);
    if (bVar2) {
      buffer = String::operator_cast_to_char16_t_(&this->ExecutionModeLimits);
      iterationsNeeded_1 =
           PAL_swscanf(buffer,L"%u.%u.%u.%u.%u",&autoProfilingInterpreter1Limit,&simpleJitLimit,
                       &profilingInterpreter1Limit,&scannedCount,&iterationsNeeded);
      if (iterationsNeeded_1 != 5) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                    ,0x272,"(scannedCount == 5)","scannedCount == 5");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      Enable(this,AutoProfilingInterpreter0LimitFlag);
      Enable(this,ProfilingInterpreter0LimitFlag);
      Enable(this,AutoProfilingInterpreter1LimitFlag);
      Enable(this,SimpleJitLimitFlag);
      Enable(this,ProfilingInterpreter1LimitFlag);
      this->AutoProfilingInterpreter0Limit = autoProfilingInterpreter1Limit;
      this->ProfilingInterpreter0Limit = simpleJitLimit;
      this->AutoProfilingInterpreter1Limit = profilingInterpreter1Limit;
      this->SimpleJitLimit = scannedCount;
      this->ProfilingInterpreter1Limit = iterationsNeeded;
    }
    else {
      if ((this->NewSimpleJit & 1U) == 0) {
        this->AutoProfilingInterpreter0Limit = 0xc;
        this->ProfilingInterpreter0Limit = 4;
        this->AutoProfilingInterpreter1Limit = 0x44;
        this->SimpleJitLimit = 0x15;
        this->ProfilingInterpreter1Limit = 0;
        TranslateFlagConfiguration::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)&autoProfilingInterpreter0Limit);
      }
      bVar2 = IsEnabled(this,SimpleJitAfterFlag);
      if (bVar2) {
        Enable(this,AutoProfilingInterpreter0LimitFlag);
        Enable(this,ProfilingInterpreter0LimitFlag);
        Enable(this,AutoProfilingInterpreter1LimitFlag);
        Enable(this,EnforceExecutionModeLimitsFlag);
        profilingIterationsNeeded = this->SimpleJitAfter;
        piVar3 = min<int>(&this->ProfilingInterpreter0Limit,&profilingIterationsNeeded);
        this->ProfilingInterpreter0Limit = *piVar3;
        profilingIterationsNeeded = profilingIterationsNeeded - this->ProfilingInterpreter0Limit;
        this->AutoProfilingInterpreter0Limit = profilingIterationsNeeded;
        this->AutoProfilingInterpreter1Limit = 0;
        bVar2 = IsEnabled(this,FullJitAfterFlag);
        if (bVar2) {
          Enable(this,SimpleJitLimitFlag);
          Enable(this,ProfilingInterpreter1LimitFlag);
          if (this->FullJitAfter < this->SimpleJitAfter) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                        ,0x2a6,"(SimpleJitAfter <= FullJitAfter)",
                                        "SimpleJitAfter <= FullJitAfter");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
          local_3c = this->FullJitAfter - this->SimpleJitAfter;
          iterationsNeeded_2 = 0x19;
          if ((this->NewSimpleJit & 1U) != 0) {
            iterationsNeeded_2 = 0x10;
          }
          piVar3 = min<int>(&iterationsNeeded_2,&this->FullJitAfter);
          iterationsToMove = *piVar3 - this->ProfilingInterpreter0Limit;
          if ((this->NewSimpleJit & 1U) == 0) {
            this->SimpleJitLimit = local_3c;
            piVar3 = min<int>(&this->SimpleJitLimit,&iterationsToMove);
            iterationsToMove = iterationsToMove - *piVar3;
            this->ProfilingInterpreter1Limit = 0;
          }
          else {
            piVar3 = min<int>(&this->ProfilingInterpreter1Limit,&local_3c);
            this->ProfilingInterpreter1Limit = *piVar3;
            local_3c = local_3c - this->ProfilingInterpreter1Limit;
            iterationsToMove = iterationsToMove - this->ProfilingInterpreter1Limit;
            this->SimpleJitLimit = local_3c;
          }
          if (iterationsToMove != 0) {
            piVar3 = min<int>(&this->AutoProfilingInterpreter1Limit,&iterationsToMove);
            local_48 = *piVar3;
            this->AutoProfilingInterpreter1Limit = this->AutoProfilingInterpreter1Limit - local_48;
            this->ProfilingInterpreter0Limit = local_48 + this->ProfilingInterpreter0Limit;
            iterationsToMove = iterationsToMove - local_48;
            piVar3 = min<int>(&this->AutoProfilingInterpreter0Limit,&iterationsToMove);
            local_48 = *piVar3;
            this->AutoProfilingInterpreter0Limit = this->AutoProfilingInterpreter0Limit - local_48;
            this->ProfilingInterpreter0Limit = local_48 + this->ProfilingInterpreter0Limit;
            iterationsToMove = iterationsToMove - local_48;
            if (iterationsToMove != 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                          ,0x2c8,"(profilingIterationsNeeded == 0)",
                                          "profilingIterationsNeeded == 0");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 0;
            }
          }
          if (this->AutoProfilingInterpreter0Limit + this->ProfilingInterpreter0Limit +
              this->AutoProfilingInterpreter1Limit + this->SimpleJitLimit +
              this->ProfilingInterpreter1Limit != this->FullJitAfter) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                        ,0x2d2,
                                        "(( AutoProfilingInterpreter0Limit + ProfilingInterpreter0Limit + AutoProfilingInterpreter1Limit + SimpleJitLimit + ProfilingInterpreter1Limit ) == FullJitAfter)"
                                        ,
                                        "( AutoProfilingInterpreter0Limit + ProfilingInterpreter0Limit + AutoProfilingInterpreter1Limit + SimpleJitLimit + ProfilingInterpreter1Limit ) == FullJitAfter"
                                       );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
        }
        if (this->AutoProfilingInterpreter0Limit + this->ProfilingInterpreter0Limit +
            this->AutoProfilingInterpreter1Limit != this->SimpleJitAfter) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                      ,0x2da,
                                      "(( AutoProfilingInterpreter0Limit + ProfilingInterpreter0Limit + AutoProfilingInterpreter1Limit ) == SimpleJitAfter)"
                                      ,
                                      "( AutoProfilingInterpreter0Limit + ProfilingInterpreter0Limit + AutoProfilingInterpreter1Limit ) == SimpleJitAfter"
                                     );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        this->EnforceExecutionModeLimits = true;
      }
      else {
        bVar2 = IsEnabled(this,FullJitAfterFlag);
        if (bVar2) {
          Enable(this,AutoProfilingInterpreter0LimitFlag);
          Enable(this,ProfilingInterpreter0LimitFlag);
          Enable(this,AutoProfilingInterpreter1LimitFlag);
          Enable(this,SimpleJitLimitFlag);
          Enable(this,ProfilingInterpreter1LimitFlag);
          Enable(this,EnforceExecutionModeLimitsFlag);
          local_4c = this->FullJitAfter;
          if ((this->NewSimpleJit & 1U) == 0) {
            this->ProfilingInterpreter1Limit = 0;
            piVar3 = min<int>(&this->SimpleJitLimit,&local_4c);
            this->SimpleJitLimit = *piVar3;
            local_4c = local_4c - this->SimpleJitLimit;
          }
          else {
            piVar3 = min<int>(&this->ProfilingInterpreter1Limit,&local_4c);
            this->ProfilingInterpreter1Limit = *piVar3;
            local_4c = local_4c - this->ProfilingInterpreter1Limit;
          }
          piVar3 = min<int>(&this->ProfilingInterpreter0Limit,&local_4c);
          this->ProfilingInterpreter0Limit = *piVar3;
          local_4c = local_4c - this->ProfilingInterpreter0Limit;
          if ((this->NewSimpleJit & 1U) != 0) {
            piVar3 = min<int>(&this->SimpleJitLimit,&local_4c);
            this->SimpleJitLimit = *piVar3;
            local_4c = local_4c - this->SimpleJitLimit;
          }
          piVar3 = min<int>(&this->AutoProfilingInterpreter0Limit,&local_4c);
          this->AutoProfilingInterpreter0Limit = *piVar3;
          local_4c = local_4c - this->AutoProfilingInterpreter0Limit;
          this->AutoProfilingInterpreter1Limit = local_4c;
          if (this->AutoProfilingInterpreter0Limit + this->ProfilingInterpreter0Limit +
              this->AutoProfilingInterpreter1Limit + this->SimpleJitLimit +
              this->ProfilingInterpreter1Limit != this->FullJitAfter) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                        ,0x306,
                                        "(( AutoProfilingInterpreter0Limit + ProfilingInterpreter0Limit + AutoProfilingInterpreter1Limit + SimpleJitLimit + ProfilingInterpreter1Limit ) == FullJitAfter)"
                                        ,
                                        "( AutoProfilingInterpreter0Limit + ProfilingInterpreter0Limit + AutoProfilingInterpreter1Limit + SimpleJitLimit + ProfilingInterpreter1Limit ) == FullJitAfter"
                                       );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
          this->EnforceExecutionModeLimits = true;
        }
        else {
          bVar2 = IsEnabled(this,MaxTemplatizedJitRunCountFlag);
          if ((bVar2) && (-1 < this->MaxTemplatizedJitRunCount)) {
            this->MinTemplatizedJitRunCount = this->MaxTemplatizedJitRunCount;
          }
          bVar2 = IsEnabled(this,MaxAsmJsInterpreterRunCountFlag);
          if ((bVar2) && (-1 < this->MaxAsmJsInterpreterRunCount)) {
            this->MinAsmJsInterpreterRunCount = this->MaxAsmJsInterpreterRunCount;
          }
        }
      }
    }
  }
  if ((((this->Prejit & 1U) != 0) || ((this->ForceNative & 1U) != 0)) &&
     ((this->NoNative & 1U) == 0)) {
    Enable(this,AutoProfilingInterpreter0LimitFlag);
    Enable(this,ProfilingInterpreter0LimitFlag);
    Enable(this,AutoProfilingInterpreter1LimitFlag);
    Enable(this,EnforceExecutionModeLimitsFlag);
    this->AutoProfilingInterpreter0Limit = 0;
    this->ProfilingInterpreter0Limit = 0;
    this->AutoProfilingInterpreter1Limit = 0;
    bVar2 = Phases::IsEnabled(&this->Off,SimpleJitPhase);
    if (bVar2) {
      Enable(this,SimpleJitLimitFlag);
      Enable(this,ProfilingInterpreter1LimitFlag);
      this->SimpleJitLimit = 0;
      this->ProfilingInterpreter1Limit = 0;
    }
    this->EnforceExecutionModeLimits = true;
  }
  TranslateFlagConfiguration::anon_class_8_1_8991fb9c::operator()
            ((anon_class_8_1_8991fb9c *)&autoProfilingInterpreter0Limit);
  return;
}

Assistant:

void ConfigFlagsTable::TranslateFlagConfiguration()
    {
        const auto VerifyExecutionModeLimits = [this]()
        {
            const Number zero = static_cast<Number>(0);
            const Number maxUint8 = static_cast<Number>(static_cast<uint8>(-1)); // entry point call count is uint8
            const Number maxUint16 = static_cast<Number>(static_cast<uint16>(-1));

        #if ENABLE_DEBUG_CONFIG_OPTIONS
            Assert(MinInterpretCount >= zero);
            Assert(MinInterpretCount <= maxUint16);
            Assert(MaxInterpretCount >= zero);
            Assert(MaxInterpretCount <= maxUint16);
            Assert(MinSimpleJitRunCount >= zero);
            Assert(MinSimpleJitRunCount <= maxUint8);
            Assert(MaxSimpleJitRunCount >= zero);
            Assert(MaxSimpleJitRunCount <= maxUint8);

            Assert(SimpleJitAfter >= zero);
            Assert(SimpleJitAfter <= maxUint8);
            Assert(FullJitAfter >= zero);
            Assert(FullJitAfter <= maxUint16);
        #endif

            Assert(AutoProfilingInterpreter0Limit >= zero);
            Assert(AutoProfilingInterpreter0Limit <= maxUint16);
            Assert(ProfilingInterpreter0Limit >= zero);
            Assert(ProfilingInterpreter0Limit <= maxUint16);
            Assert(AutoProfilingInterpreter1Limit >= zero);
            Assert(AutoProfilingInterpreter1Limit <= maxUint16);
            Assert(SimpleJitLimit >= zero);
            Assert(SimpleJitLimit <= maxUint8);
            Assert(ProfilingInterpreter1Limit >= zero);
            Assert(ProfilingInterpreter1Limit <= maxUint16);
            Assert(
                (
                    AutoProfilingInterpreter0Limit +
                    ProfilingInterpreter0Limit +
                    AutoProfilingInterpreter1Limit +
                    SimpleJitLimit +
                    ProfilingInterpreter1Limit
                ) <= maxUint16);
        };
        VerifyExecutionModeLimits();

    #if ENABLE_DEBUG_CONFIG_OPTIONS
    #if !DISABLE_JIT
        if(ForceDynamicProfile)
        {
            Force.Enable(DynamicProfilePhase);
        }
        if(ForceJITLoopBody)
        {
            Force.Enable(JITLoopBodyPhase);
        }
    #endif
        if(NoDeferParse)
        {
            Off.Enable(DeferParsePhase);
        }
    #endif

    #if ENABLE_DEBUG_CONFIG_OPTIONS && !DISABLE_JIT
        bool dontEnforceLimitsForSimpleJitAfterOrFullJitAfter = false;
        if((IsEnabled(MinInterpretCountFlag) || IsEnabled(MaxInterpretCountFlag)) &&
            !(IsEnabled(SimpleJitAfterFlag) || IsEnabled(FullJitAfterFlag)))
        {
            if(Off.IsEnabled(SimpleJitPhase))
            {
                Enable(FullJitAfterFlag);
                if(IsEnabled(MaxInterpretCountFlag))
                {
                    FullJitAfter = MaxInterpretCount;
                }
                else
                {
                    FullJitAfter = MinInterpretCount;
                    dontEnforceLimitsForSimpleJitAfterOrFullJitAfter = true;
                }
            }
            else
            {
                Enable(SimpleJitAfterFlag);
                if(IsEnabled(MaxInterpretCountFlag))
                {
                    SimpleJitAfter = MaxInterpretCount;
                }
                else
                {
                    SimpleJitAfter = MinInterpretCount;
                    dontEnforceLimitsForSimpleJitAfterOrFullJitAfter = true;
                }
                if((IsEnabled(MinInterpretCountFlag) && IsEnabled(MinSimpleJitRunCountFlag)) ||
                    IsEnabled(MaxSimpleJitRunCountFlag))
                {
                    Enable(FullJitAfterFlag);
                    FullJitAfter = SimpleJitAfter;
                    if(IsEnabled(MaxSimpleJitRunCountFlag))
                    {
                        FullJitAfter += MaxSimpleJitRunCount;
                    }
                    else
                    {
                        FullJitAfter += MinSimpleJitRunCount;
                        Assert(dontEnforceLimitsForSimpleJitAfterOrFullJitAfter);
                    }
                }
            }
        }

        // Configure execution mode limits
        do
        {
            if(IsEnabled(AutoProfilingInterpreter0LimitFlag) ||
                IsEnabled(ProfilingInterpreter0LimitFlag) ||
                IsEnabled(AutoProfilingInterpreter1LimitFlag) ||
                IsEnabled(SimpleJitLimitFlag) ||
                IsEnabled(ProfilingInterpreter1LimitFlag))
            {
                break;
            }

            if(IsEnabled(ExecutionModeLimitsFlag))
            {
                uint autoProfilingInterpreter0Limit;
                uint profilingInterpreter0Limit;
                uint autoProfilingInterpreter1Limit;
                uint simpleJitLimit;
                uint profilingInterpreter1Limit;
                const int scannedCount =
                    swscanf_s(
                        static_cast<LPCWSTR>(ExecutionModeLimits),
                        _u("%u.%u.%u.%u.%u"),
                        &autoProfilingInterpreter0Limit,
                        &profilingInterpreter0Limit,
                        &autoProfilingInterpreter1Limit,
                        &simpleJitLimit,
                        &profilingInterpreter1Limit);
                Assert(scannedCount == 5);

                Enable(AutoProfilingInterpreter0LimitFlag);
                Enable(ProfilingInterpreter0LimitFlag);
                Enable(AutoProfilingInterpreter1LimitFlag);
                Enable(SimpleJitLimitFlag);
                Enable(ProfilingInterpreter1LimitFlag);

                AutoProfilingInterpreter0Limit = autoProfilingInterpreter0Limit;
                ProfilingInterpreter0Limit = profilingInterpreter0Limit;
                AutoProfilingInterpreter1Limit = autoProfilingInterpreter1Limit;
                SimpleJitLimit = simpleJitLimit;
                ProfilingInterpreter1Limit = profilingInterpreter1Limit;
                break;
            }

            if(!NewSimpleJit)
            {
                // Use the defaults for old simple JIT. The flags are not enabled here because the values can be changed later
                // based on other flags, only the defaults values are adjusted here.
                AutoProfilingInterpreter0Limit = DEFAULT_CONFIG_AutoProfilingInterpreter0Limit;
                ProfilingInterpreter0Limit = DEFAULT_CONFIG_ProfilingInterpreter0Limit;
                CompileAssert(
                    DEFAULT_CONFIG_AutoProfilingInterpreter0Limit <= DEFAULT_CONFIG_AutoProfilingInterpreterLimit_OldSimpleJit);
                AutoProfilingInterpreter1Limit =
                    DEFAULT_CONFIG_AutoProfilingInterpreterLimit_OldSimpleJit - DEFAULT_CONFIG_AutoProfilingInterpreter0Limit;
                CompileAssert(DEFAULT_CONFIG_ProfilingInterpreter0Limit <= DEFAULT_CONFIG_SimpleJitLimit_OldSimpleJit);
                SimpleJitLimit = DEFAULT_CONFIG_SimpleJitLimit_OldSimpleJit - DEFAULT_CONFIG_ProfilingInterpreter0Limit;
                ProfilingInterpreter1Limit = 0;
                VerifyExecutionModeLimits();
            }

            if (IsEnabled(SimpleJitAfterFlag))
            {
                Enable(AutoProfilingInterpreter0LimitFlag);
                Enable(ProfilingInterpreter0LimitFlag);
                Enable(AutoProfilingInterpreter1LimitFlag);
                Enable(EnforceExecutionModeLimitsFlag);

                {
                    Js::Number iterationsNeeded = SimpleJitAfter;
                    ProfilingInterpreter0Limit = min(ProfilingInterpreter0Limit, iterationsNeeded);
                    iterationsNeeded -= ProfilingInterpreter0Limit;
                    AutoProfilingInterpreter0Limit = iterationsNeeded;
                    AutoProfilingInterpreter1Limit = 0;
                }

                if(IsEnabled(FullJitAfterFlag))
                {
                    Enable(SimpleJitLimitFlag);
                    Enable(ProfilingInterpreter1LimitFlag);

                    Assert(SimpleJitAfter <= FullJitAfter);
                    Js::Number iterationsNeeded = FullJitAfter - SimpleJitAfter;
                    Js::Number profilingIterationsNeeded =
                        min(NewSimpleJit
                                ? DEFAULT_CONFIG_MinProfileIterations
                                : DEFAULT_CONFIG_MinProfileIterations_OldSimpleJit,
                            FullJitAfter) -
                        ProfilingInterpreter0Limit;
                    if(NewSimpleJit)
                    {
                        ProfilingInterpreter1Limit = min(ProfilingInterpreter1Limit, iterationsNeeded);
                        iterationsNeeded -= ProfilingInterpreter1Limit;
                        profilingIterationsNeeded -= ProfilingInterpreter1Limit;
                        SimpleJitLimit = iterationsNeeded;
                    }
                    else
                    {
                        SimpleJitLimit = iterationsNeeded;
                        profilingIterationsNeeded -= min(SimpleJitLimit, profilingIterationsNeeded);
                        ProfilingInterpreter1Limit = 0;
                    }

                    if(profilingIterationsNeeded != 0)
                    {
                        Js::Number iterationsToMove = min(AutoProfilingInterpreter1Limit, profilingIterationsNeeded);
                        AutoProfilingInterpreter1Limit -= iterationsToMove;
                        ProfilingInterpreter0Limit += iterationsToMove;
                        profilingIterationsNeeded -= iterationsToMove;

                        iterationsToMove = min(AutoProfilingInterpreter0Limit, profilingIterationsNeeded);
                        AutoProfilingInterpreter0Limit -= iterationsToMove;
                        ProfilingInterpreter0Limit += iterationsToMove;
                        profilingIterationsNeeded -= iterationsToMove;

                        Assert(profilingIterationsNeeded == 0);
                    }

                    Assert(
                        (
                            AutoProfilingInterpreter0Limit +
                            ProfilingInterpreter0Limit +
                            AutoProfilingInterpreter1Limit +
                            SimpleJitLimit +
                            ProfilingInterpreter1Limit
                        ) == FullJitAfter);
                }

                Assert(
                    (
                        AutoProfilingInterpreter0Limit +
                        ProfilingInterpreter0Limit +
                        AutoProfilingInterpreter1Limit
                    ) == SimpleJitAfter);
                EnforceExecutionModeLimits = true;
                break;
            }

            if(IsEnabled(FullJitAfterFlag))
            {
                Enable(AutoProfilingInterpreter0LimitFlag);
                Enable(ProfilingInterpreter0LimitFlag);
                Enable(AutoProfilingInterpreter1LimitFlag);
                Enable(SimpleJitLimitFlag);
                Enable(ProfilingInterpreter1LimitFlag);
                Enable(EnforceExecutionModeLimitsFlag);

                Js::Number iterationsNeeded = FullJitAfter;
                if(NewSimpleJit)
                {
                    ProfilingInterpreter1Limit = min(ProfilingInterpreter1Limit, iterationsNeeded);
                    iterationsNeeded -= ProfilingInterpreter1Limit;
                }
                else
                {
                    ProfilingInterpreter1Limit = 0;
                    SimpleJitLimit = min(SimpleJitLimit, iterationsNeeded);
                    iterationsNeeded -= SimpleJitLimit;
                }
                ProfilingInterpreter0Limit = min(ProfilingInterpreter0Limit, iterationsNeeded);
                iterationsNeeded -= ProfilingInterpreter0Limit;
                if(NewSimpleJit)
                {
                    SimpleJitLimit = min(SimpleJitLimit, iterationsNeeded);
                    iterationsNeeded -= SimpleJitLimit;
                }
                AutoProfilingInterpreter0Limit = min(AutoProfilingInterpreter0Limit, iterationsNeeded);
                iterationsNeeded -= AutoProfilingInterpreter0Limit;
                AutoProfilingInterpreter1Limit = iterationsNeeded;

                Assert(
                    (
                        AutoProfilingInterpreter0Limit +
                        ProfilingInterpreter0Limit +
                        AutoProfilingInterpreter1Limit +
                        SimpleJitLimit +
                        ProfilingInterpreter1Limit
                    ) == FullJitAfter);
                EnforceExecutionModeLimits = true;
                break;
            }
            if (IsEnabled(MaxTemplatizedJitRunCountFlag))
            {
                if (MaxTemplatizedJitRunCount >= 0)
                {
                    MinTemplatizedJitRunCount = MaxTemplatizedJitRunCount;
                }
            }
            if (IsEnabled(MaxAsmJsInterpreterRunCountFlag))
            {
                if (MaxAsmJsInterpreterRunCount >= 0)
                {
                    MinAsmJsInterpreterRunCount = MaxAsmJsInterpreterRunCount;
                }
            }

        } while(false);
    #endif

        if( (
            #ifdef ENABLE_PREJIT
                Prejit ||
            #endif
                ForceNative
            ) &&
            !NoNative)
        {
            Enable(AutoProfilingInterpreter0LimitFlag);
            Enable(ProfilingInterpreter0LimitFlag);
            Enable(AutoProfilingInterpreter1LimitFlag);
            Enable(EnforceExecutionModeLimitsFlag);

            // Override any relevant automatic configuration above
            AutoProfilingInterpreter0Limit = 0;
            ProfilingInterpreter0Limit = 0;
            AutoProfilingInterpreter1Limit = 0;
        #if ENABLE_DEBUG_CONFIG_OPTIONS
            if(Off.IsEnabled(SimpleJitPhase))
            {
                Enable(SimpleJitLimitFlag);
                Enable(ProfilingInterpreter1LimitFlag);

                SimpleJitLimit = 0;
                ProfilingInterpreter1Limit = 0;
            }
        #endif

            EnforceExecutionModeLimits = true;
        }

        VerifyExecutionModeLimits();
    }